

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::BlobProto::BlobProto(BlobProto *this,BlobProto *from)

{
  int iVar1;
  void *pvVar2;
  int32 iVar3;
  int32 iVar4;
  int32 iVar5;
  BlobShape *this_00;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__BlobProto_006f8220
  ;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  (this->data_).current_size_ = 0;
  *(undefined8 *)&(this->data_).total_size_ = 0;
  *(undefined4 *)((long)&(this->data_).rep_ + 4) = 0;
  iVar1 = (from->data_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<float>::Reserve(&this->data_,iVar1);
    memcpy(((this->data_).rep_)->elements,((from->data_).rep_)->elements,
           (long)(from->data_).current_size_ << 2);
    (this->data_).current_size_ = (from->data_).current_size_;
  }
  (this->diff_).current_size_ = 0;
  (this->diff_).total_size_ = 0;
  (this->diff_).rep_ = (Rep *)0x0;
  iVar1 = (from->diff_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<float>::Reserve(&this->diff_,iVar1);
    memcpy(((this->diff_).rep_)->elements,((from->diff_).rep_)->elements,
           (long)(from->diff_).current_size_ << 2);
    (this->diff_).current_size_ = (from->diff_).current_size_;
  }
  (this->double_data_).current_size_ = 0;
  (this->double_data_).total_size_ = 0;
  (this->double_data_).rep_ = (Rep *)0x0;
  iVar1 = (from->double_data_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<double>::Reserve(&this->double_data_,iVar1);
    memcpy(((this->double_data_).rep_)->elements,((from->double_data_).rep_)->elements,
           (long)(from->double_data_).current_size_ << 3);
    (this->double_data_).current_size_ = (from->double_data_).current_size_;
  }
  (this->double_diff_).current_size_ = 0;
  (this->double_diff_).total_size_ = 0;
  (this->double_diff_).rep_ = (Rep *)0x0;
  iVar1 = (from->double_diff_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<double>::Reserve(&this->double_diff_,iVar1);
    memcpy(((this->double_diff_).rep_)->elements,((from->double_diff_).rep_)->elements,
           (long)(from->double_diff_).current_size_ << 3);
    (this->double_diff_).current_size_ = (from->double_diff_).current_size_;
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (((from->_has_bits_).has_bits_[0] & 1) == 0) {
    this_00 = (BlobShape *)0x0;
  }
  else {
    this_00 = (BlobShape *)operator_new(0x30);
    BlobShape::BlobShape(this_00,from->shape_);
  }
  this->shape_ = this_00;
  iVar3 = from->channels_;
  iVar4 = from->height_;
  iVar5 = from->width_;
  this->num_ = from->num_;
  this->channels_ = iVar3;
  this->height_ = iVar4;
  this->width_ = iVar5;
  return;
}

Assistant:

BlobProto::BlobProto(const BlobProto& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      data_(from.data_),
      diff_(from.diff_),
      double_data_(from.double_data_),
      double_diff_(from.double_diff_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_shape()) {
    shape_ = new ::caffe::BlobShape(*from.shape_);
  } else {
    shape_ = NULL;
  }
  ::memcpy(&num_, &from.num_,
    reinterpret_cast<char*>(&width_) -
    reinterpret_cast<char*>(&num_) + sizeof(width_));
  // @@protoc_insertion_point(copy_constructor:caffe.BlobProto)
}